

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall spvtools::opt::analysis::Opaque::~Opaque(Opaque *this)

{
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Opaque_008acca8;
  std::__cxx11::string::_M_dispose();
  analysis::Type::~Type(&this->super_Type);
  return;
}

Assistant:

Opaque(const Opaque&) = default;